

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

void MlmWrap::message_reactor_task(zsock_t *pipe,void *args)

{
  zloop_t *self_00;
  zsock_t *sock;
  undefined8 uVar1;
  void *in_RSI;
  zsock_t *in_RDI;
  MlmWrap *unaff_retaddr;
  zloop_t *loop;
  MlmWrap *self;
  zloop_t *local_20;
  void *local_18;
  zsock_t *local_8;
  
  local_18 = in_RSI;
  local_8 = in_RDI;
  zsock_signal(in_RDI,'\0');
  self_00 = zloop_new();
  local_20 = self_00;
  sock = (zsock_t *)mlm_client_msgpipe(*(undefined8 *)((long)local_18 + 0x30));
  zloop_reader(self_00,sock,handle_mlm_msgpipe,local_18);
  zloop_reader(local_20,local_8,handle_usr_msgpipe,local_18);
  zloop_timer(local_20,0x19,0,handle_abs_timer,local_18);
  *(zloop_t **)((long)local_18 + 0x38) = local_20;
  *(zsock_t **)((long)local_18 + 0x48) = local_8;
  uVar1 = mlm_client_msgpipe(*(undefined8 *)((long)local_18 + 0x30));
  *(undefined8 *)((long)local_18 + 0x50) = uVar1;
  zloop_start(local_20);
  zloop_reader_end(local_20,*(zsock_t **)((long)local_18 + 0x48));
  zloop_reader_end(local_20,*(zsock_t **)((long)local_18 + 0x50));
  if (*(long *)((long)local_18 + 0x58) != 0) {
    zloop_reader_end(local_20,*(zsock_t **)((long)local_18 + 0x58));
  }
  zloop_destroy(&local_20);
  if (*(long *)((long)local_18 + 0x58) != 0) {
    zsock_destroy_checked
              ((zsock_t **)((long)local_18 + 0x58),
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/networkincludes.cpp"
               ,0x51f);
  }
  mlm_client_destroy((long)local_18 + 0x30);
  removeAllSubs(unaff_retaddr);
  zsock_signal(local_8,'\0');
  return;
}

Assistant:

void MlmWrap::message_reactor_task(zsock_t *pipe, void *args){
    MlmWrap *self = (MlmWrap*)args;
    zsock_signal(pipe, 0);

    //Create loop
    zloop_t *loop = zloop_new();

    //Set reader for pipe for incoming messages
    zloop_reader(loop, mlm_client_msgpipe(self->client), MlmWrap::handle_mlm_msgpipe, self);
    //Set reader for pipe for outgoing messages
    zloop_reader(loop, pipe, MlmWrap::handle_usr_msgpipe, self);
    //Set timer that runs for Abstractmoduleclient to utilize
    zloop_timer(loop, 25, 0, MlmWrap::handle_abs_timer, self);
    //Set variables
    self->reactor = loop;
    self->usrpipe = pipe;
    self->mlmpipe = mlm_client_msgpipe(self->client);

    //Start loop
    zloop_start(loop);

    //End and deallocate
    zloop_reader_end(loop, self->usrpipe);
    zloop_reader_end(loop, self->mlmpipe);
    if(self->hardwaresock) zloop_reader_end(loop, self->hardwaresock);
    zloop_destroy(&loop);
    if(self->hardwaresock) zsock_destroy(&self->hardwaresock);
    mlm_client_destroy(&self->client);
    self->removeAllSubs();
    zsock_signal(pipe, 0);
}